

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

bool __thiscall
LTACMasterdataChannel::UpdateStaticData
          (LTACMasterdataChannel *this,FDKeyTy *keyAc,FDStaticData *dat)

{
  system_error *e;
  iterator fdIter;
  lock_guard<std::mutex> mapFdLock;
  LTFlightData *in_stack_00000070;
  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
  *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  _Self local_48;
  _Self local_40 [7];
  bool local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff90,(mutex_type *)in_stack_ffffffffffffff88);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x1c4e31);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
       ::end(in_stack_ffffffffffffff88);
  local_1 = std::operator==(local_40,&local_48);
  if (!local_1) {
    std::_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_> *)
               in_stack_ffffffffffffff90);
    LTFlightData::UpdateData(in_stack_00000070,(FDStaticData *)this,(double)keyAc,dat._4_4_);
  }
  local_1 = !local_1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1c4f77);
  return (bool)(local_1 & 1);
}

Assistant:

bool LTACMasterdataChannel::UpdateStaticData (const LTFlightData::FDKeyTy& keyAc,
                                              const LTFlightData::FDStaticData& dat)
{
    // Find and update respective flight data
    try {
        // from here on access to fdMap guarded by a mutex
        std::lock_guard<std::mutex> mapFdLock (mapFdMutex);
        
        // get the fd object from the map, key is the transpIcao
        mapLTFlightDataTy::iterator fdIter = mapFd.find(keyAc);
        if (fdIter == mapFd.end())
            return false;                   // not found
        
        // do the actual update
        fdIter->second.UpdateData(dat, NAN, currRequ.type);
        return true;
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
    }
    
    // must have caught an error
    return false;
}